

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::unimposeNeumannBC(MLNodeLaplacian *this,int amrlev,Any *a_rhs)

{
  int *piVar1;
  pointer paVar2;
  int i;
  long lVar3;
  FabArray<amrex::FArrayBox> *this_00;
  Box bx;
  MFIter mfi;
  GpuArray<amrex::LinOpBCType,_3U> local_148;
  GpuArray<amrex::LinOpBCType,_3U> local_138;
  Box local_128;
  MFIter local_100;
  MFItInfo local_a0;
  Box local_8c;
  Array4<double> local_70;
  
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
    lVar3 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                      super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[amrlev].
                      super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    local_128.smallend.vect._0_8_ = *(undefined8 *)(lVar3 + 0xac);
    local_128.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar3 + 0xb8) >> 0x20);
    local_128._20_8_ = *(undefined8 *)(lVar3 + 0xc0);
    local_128.smallend.vect[2] = (int)*(undefined8 *)(lVar3 + 0xb4);
    local_128.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar3 + 0xb4) >> 0x20);
    lVar3 = 0;
    do {
      if ((local_128.btype.itype >> ((uint)lVar3 & 0x1f) & 1) == 0) {
        piVar1 = local_128.bigend.vect + lVar3;
        *piVar1 = *piVar1 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_128.btype.itype = 7;
    paVar2 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_138.arr._0_8_ = *(undefined8 *)paVar2->_M_elems;
    local_138.arr[2] = paVar2->_M_elems[2];
    paVar2 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_148.arr._0_8_ = *(undefined8 *)paVar2->_M_elems;
    local_148.arr[2] = paVar2->_M_elems[2];
    this_00 = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
    local_a0.num_streams = Gpu::Device::max_gpu_streams;
    local_a0.do_tiling = true;
    local_a0.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    local_a0.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    local_a0.tilesize.vect[2] = DAT_00810ec0;
    local_a0.dynamic = true;
    local_a0.device_sync = true;
    MFIter::MFIter(&local_100,&this_00->super_FabArrayBase,&local_a0);
    if (local_100.currentIndex < local_100.endIndex) {
      do {
        MFIter::tilebox(&local_8c,&local_100);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_70,this_00,&local_100);
        mlndlap_unimpose_neumann_bc(&local_8c,&local_70,&local_128,&local_138,&local_148);
        MFIter::operator++(&local_100);
      } while (local_100.currentIndex < local_100.endIndex);
    }
    MFIter::~MFIter(&local_100);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::unimposeNeumannBC (int amrlev, Any& a_rhs) const
{
    if (m_coarsening_strategy == CoarseningStrategy::RAP) {
        const Box& nddom = amrex::surroundingNodes(Geom(amrlev).Domain());
        const auto lobc = LoBC();
        const auto hibc = HiBC();

        AMREX_ASSERT(a_rhs.is<MultiFab>());
        MultiFab& rhs = a_rhs.get<MultiFab>();

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(rhs,mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& rhsarr = rhs.array(mfi);
            mlndlap_unimpose_neumann_bc(bx, rhsarr, nddom, lobc, hibc);
        }
    }
}